

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
::operator()(gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
             *this,long row,long rows,long col,long cols,GemmParallelInfo<long> *info)

{
  Index depth;
  Scalar *_lhs;
  Index lhsStride;
  Scalar *_rhs;
  Index rhsStride;
  Scalar *_res;
  Index resStride;
  long in_RDX;
  long in_RDI;
  long in_R8;
  GemmParallelInfo<long> *in_R9;
  Index in_stack_ffffffffffffff70;
  Index in_stack_ffffffffffffff78;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff80;
  undefined8 local_38;
  
  local_38 = in_R8;
  if (in_R8 == -1) {
    local_38 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x154ca4);
  }
  depth = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x154ccd);
  _lhs = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  lhsStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_0,__1,__1> *)0x154d03);
  _rhs = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  rhsStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_0,__1,__1> *)0x154d38);
  _res = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  resStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_0,__1,__1> *)0x154d67);
  general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>::run
            (in_RDX,local_38,depth,_lhs,lhsStride,_rhs,rhsStride,_res,resStride,
             *(ResScalar *)(in_RDI + 0x18),*(level3_blocking<double,_double> **)(in_RDI + 0x20),
             in_R9);
  return;
}

Assistant:

void operator() (Index row, Index rows, Index col=0, Index cols=-1, GemmParallelInfo<Index>* info=0) const
  {
    if(cols==-1)
      cols = m_rhs.cols();

    Gemm::run(rows, cols, m_lhs.cols(),
              &m_lhs.coeffRef(row,0), m_lhs.outerStride(),
              &m_rhs.coeffRef(0,col), m_rhs.outerStride(),
              (Scalar*)&(m_dest.coeffRef(row,col)), m_dest.outerStride(),
              m_actualAlpha, m_blocking, info);
  }